

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_importingUnitsWithSameNameDoesntResultInRepeatedUnits_Test::
ModelFlattening_importingUnitsWithSameNameDoesntResultInRepeatedUnits_Test
          (ModelFlattening_importingUnitsWithSameNameDoesntResultInRepeatedUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0016ad20;
  return;
}

Assistant:

TEST(ModelFlattening, importingUnitsWithSameNameDoesntResultInRepeatedUnits)
{
    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();

    auto model = parser->parseModel(fileContents("importer/triangle_units_point_I.cellml"));

    EXPECT_EQ(size_t(0), importer->errorCount());

    importer->resolveImports(model, resourcePath("importer"));

    for (size_t i = 0; i < importer->libraryCount(); ++i) {
        validator->validateModel(importer->library(i));
        EXPECT_EQ(size_t(0), validator->errorCount());
    }

    auto flattenedModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(1), flattenedModel->unitsCount());
    EXPECT_EQ("mm", flattenedModel->units(0)->name());
}